

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O3

list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* anon_unknown.dwarf_19656::nameSplit
            (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,string *name)

{
  iterator iVar1;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *plVar2;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *extraout_RAX;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *extraout_RAX_00;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *extraout_RAX_01;
  anon_union_16_2_ba345be5_for_m_Storage local_38;
  ulong local_28;
  iterator_range<const_char_*> local_20;
  
  (__return_storage_ptr__->
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl._M_node._M_size = 0;
  local_20.super_iterator_range_base<const_char_*,_boost::iterators::random_access_traversal_tag>.
  super_iterator_range_base<const_char_*,_boost::iterators::bidirectional_traversal_tag>.
  super_iterator_range_base<const_char_*,_boost::iterators::incrementable_traversal_tag>.m_Begin =
       "/";
  local_20.super_iterator_range_base<const_char_*,_boost::iterators::random_access_traversal_tag>.
  super_iterator_range_base<const_char_*,_boost::iterators::bidirectional_traversal_tag>.
  super_iterator_range_base<const_char_*,_boost::iterators::incrementable_traversal_tag>.m_End = "";
  boost::algorithm::detail::is_any_ofF<char>::is_any_ofF<boost::iterator_range<char_const*>>
            ((is_any_ofF<char> *)&local_38,&local_20);
  plVar2 = boost::algorithm::
           split<std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string_const&,boost::algorithm::detail::is_any_ofF<char>>
                     (__return_storage_ptr__,name,(is_any_ofF<char> *)&local_38,token_compress_on);
  if ((0x10 < local_28) && (local_38.m_dynSet != (set_value_type *)0x0)) {
    operator_delete__(local_38.m_dynSet);
    plVar2 = extraout_RAX;
  }
  while( true ) {
    iVar1._M_node =
         (__return_storage_ptr__->
         super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl._M_node.super__List_node_base._M_next;
    if (iVar1._M_node == (_List_node_base *)__return_storage_ptr__) {
      return plVar2;
    }
    if (iVar1._M_node[1]._M_prev != (_List_node_base *)0x0) break;
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase(__return_storage_ptr__,iVar1);
    plVar2 = extraout_RAX_00;
  }
  while( true ) {
    if (iVar1._M_node == (_List_node_base *)__return_storage_ptr__) {
      return plVar2;
    }
    iVar1._M_node =
         (__return_storage_ptr__->
         super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl._M_node.super__List_node_base._M_prev;
    if (iVar1._M_node[1]._M_prev != (_List_node_base *)0x0) break;
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase(__return_storage_ptr__,iVar1);
    iVar1._M_node =
         (__return_storage_ptr__->
         super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl._M_node.super__List_node_base._M_next;
    plVar2 = extraout_RAX_01;
  }
  return plVar2;
}

Assistant:

static list<string> nameSplit(std::string const& name)
    {
        list<string> separators;
        split(separators, name, is_any_of("/"), boost::token_compress_on);
        while(!separators.empty() && separators.front().empty())
            separators.pop_front();
        while(!separators.empty() && separators.back().empty())
            separators.pop_back();
        return separators;
    }